

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::EmitAddtlInfo_SnapMapInfo(SnapObject *snpObject,FileWriter *writer)

{
  SnapMapInfo *pSVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  byte local_25;
  uint local_24;
  uint32 i;
  SnapMapInfo *mapInfo;
  FileWriter *writer_local;
  SnapObject *snpObject_local;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapMapInfo*,(TTD::NSSnapObjects::SnapObjectType)26>
                     (snpObject);
  FileWriter::WriteLengthValue(writer,pSVar1->MapSize,CommaAndBigSpaceSeparator);
  if (pSVar1->MapSize != 0) {
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    uVar2 = extraout_RDX;
    for (local_24 = 0; local_24 < pSVar1->MapSize; local_24 = local_24 + 2) {
      local_25 = 3;
      if (local_24 == 0) {
        local_25 = 2;
      }
      (*writer->_vptr_FileWriter[4])
                (writer,(ulong)local_25,CONCAT71((int7)((ulong)uVar2 >> 8),2),
                 (ulong)CONCAT31((int3)(local_24 >> 8),local_25));
      NSSnapValues::EmitTTDVar(pSVar1->MapKeyValueArray[local_24],writer,NoSeparator);
      NSSnapValues::EmitTTDVar(pSVar1->MapKeyValueArray[local_24 + 1],writer,CommaSeparator);
      (*writer->_vptr_FileWriter[5])();
      uVar2 = extraout_RDX_00;
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
  }
  return;
}

Assistant:

void EmitAddtlInfo_SnapMapInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapMapInfo* mapInfo = SnapObjectGetAddtlInfoAs<SnapMapInfo*, SnapObjectType::SnapMapObject>(snpObject);

            writer->WriteLengthValue(mapInfo->MapSize, NSTokens::Separator::CommaAndBigSpaceSeparator);

            if(mapInfo->MapSize > 0)
            {
                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                for(uint32 i = 0; i < mapInfo->MapSize; i += 2)
                {
                    writer->WriteSequenceStart(i != 0 ? NSTokens::Separator::CommaAndBigSpaceSeparator : NSTokens::Separator::BigSpaceSeparator);
                    NSSnapValues::EmitTTDVar(mapInfo->MapKeyValueArray[i], writer, NSTokens::Separator::NoSeparator);
                    NSSnapValues::EmitTTDVar(mapInfo->MapKeyValueArray[i + 1], writer, NSTokens::Separator::CommaSeparator);
                    writer->WriteSequenceEnd();
                }
                writer->WriteSequenceEnd();
            }
        }